

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::StringMaker<std::tuple<int>_>::convert
                   (String *__return_storage_ptr__,tuple<int> *in)

{
  ostream *poVar1;
  ostringstream oss;
  char *local_1b0 [4];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"(");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(in->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>.
                             _M_head_impl);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  String::String(__return_storage_ptr__,local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static String convert(const std::tuple<T>& in)
  {
    std::ostringstream oss;
    oss << "(" << std::get<0>(in) << ")";
    return oss.str().c_str();
  }